

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system_posix.cxx
# Opt level: O2

xr_reader * __thiscall xray_re::xr_file_system::r_open(xr_file_system *this,char *path)

{
  ulong __size;
  uint8_t *data;
  FILE *__stream;
  size_t sVar1;
  xr_reader *this_00;
  CPath p;
  
  CPath::CPath((CPath *)&p.super_path,path);
  CPath::make_preferred_abi_cxx11_((CPath *)&p.super_path);
  __size = std::filesystem::file_size(&p.super_path);
  if (__size >> 0x20 == 0) {
    data = (uint8_t *)malloc(__size);
    if (data != (uint8_t *)0x0) {
      __stream = fopen(p.super_path._M_pathname._M_dataplus._M_p,"r");
      if (__stream != (FILE *)0x0) {
        sVar1 = fread(data,1,__size,__stream);
        if (sVar1 == __size) {
          this_00 = (xr_reader *)operator_new(0x28);
          xr_temp_reader::xr_temp_reader((xr_temp_reader *)this_00,data,__size);
          goto LAB_00182e47;
        }
      }
      free(data);
    }
  }
  this_00 = (xr_reader *)0x0;
LAB_00182e47:
  std::filesystem::__cxx11::path::~path(&p.super_path);
  return this_00;
}

Assistant:

xr_reader* xr_file_system::r_open(const char* path) const
{
using namespace std;

CPath p(path);
xr_reader* r = nullptr;
uint8_t* data;
uintmax_t len;

	p.make_preferred();
	len = fs::file_size(p);
	if(len > numeric_limits<uint32_t>::max())
		return nullptr;

	data = (uint8_t*)malloc(len);
	if(data != nullptr)
	{
		FILE* infile = fopen(p.c_str(), "r");

		if((infile != nullptr) && (fread(data, 1, len, infile) == len))
			r = new xr_temp_reader(data, len);
		else
			free(data);
	}

	return r;
}